

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O0

UBool __thiscall
icu_63::TimeZoneNames::MatchInfoCollection::getTimeZoneIDAt
          (MatchInfoCollection *this,int32_t idx,UnicodeString *tzID)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  MatchInfo *match;
  UnicodeString *tzID_local;
  int32_t idx_local;
  MatchInfoCollection *this_local;
  
  UnicodeString::remove(tzID,(char *)CONCAT44(in_register_00000034,idx));
  pvVar1 = UVector::elementAt(this->fMatches,idx);
  if ((pvVar1 == (void *)0x0) || (*(char *)((long)pvVar1 + 0x4c) == '\0')) {
    this_local._7_1_ = '\0';
  }
  else {
    UnicodeString::setTo(tzID,(UnicodeString *)((long)pvVar1 + 8));
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
TimeZoneNames::MatchInfoCollection::getTimeZoneIDAt(int32_t idx, UnicodeString& tzID) const {
    tzID.remove();
    const MatchInfo* match = (const MatchInfo*)fMatches->elementAt(idx);
    if (match && match->isTZID) {
        tzID.setTo(match->id);
        return TRUE;
    }
    return FALSE;
}